

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QCss::MediaRule>::moveAppend
          (QGenericArrayOps<QCss::MediaRule> *this,MediaRule *b,MediaRule *e)

{
  qsizetype *pqVar1;
  MediaRule *pMVar2;
  
  if (b != e) {
    pMVar2 = (this->super_QArrayDataPointer<QCss::MediaRule>).ptr;
    for (; b < e; b = b + 1) {
      QCss::MediaRule::MediaRule(pMVar2 + (this->super_QArrayDataPointer<QCss::MediaRule>).size,b);
      pqVar1 = &(this->super_QArrayDataPointer<QCss::MediaRule>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }